

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O0

float __thiscall mraa::Iio::readFloat(Iio *this,string *attributeName)

{
  mraa_iio_context p_Var1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  runtime_error *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  float local_1c;
  mraa_result_t res;
  float value;
  string *attributeName_local;
  Iio *this_local;
  
  p_Var1 = this->m_iio;
  _res = attributeName;
  attributeName_local = (string *)this;
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = mraa_iio_read_float(p_Var1,uVar3,&local_1c);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,"IIO readFloat for attibute ");
    poVar4 = std::operator<<(poVar4,(string *)_res);
    std::operator<<(poVar4," failed");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_1c8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_1c;
}

Assistant:

float
    readFloat(const std::string& attributeName) const
    {
        float value;
        mraa_result_t res = mraa_iio_read_float(m_iio, attributeName.c_str(), &value);
        if (res != MRAA_SUCCESS) {
            std::ostringstream oss;
            oss << "IIO readFloat for attibute " << attributeName << " failed";
            throw std::runtime_error(oss.str());
        }
        return value;
    }